

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QSpanCollection::updateRemovedRows(QSpanCollection *this,int start,int end)

{
  size_t *psVar1;
  Index *this_00;
  _List_node_base *p_Var2;
  QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>
  *pQVar3;
  undefined8 *******pppppppuVar4;
  bool bVar5;
  int iVar6;
  _List_node_base *p_Var7;
  iterator iVar8;
  _Base_ptr p_Var9;
  const_iterator cVar10;
  _Rb_tree_node_base *p_Var11;
  const_iterator cVar12;
  SubIndex *this_01;
  undefined8 *******pppppppuVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  QSpanCollection *pQVar17;
  QSpanCollection *pQVar18;
  long in_FS_OFFSET;
  Span *span_1;
  Span *span;
  const_iterator local_98;
  int local_6c;
  QMap<int,_QSpanCollection::Span_*> local_68;
  QMap<int,_QSpanCollection::Span_*> local_60;
  undefined8 *******local_58;
  undefined8 *******pppppppuStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar17 = (QSpanCollection *)
            (this->spans).
            super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (pQVar17 != this) {
    local_48 = 0;
    iVar6 = (end - start) + 1;
    local_58 = &local_58;
    pppppppuStack_50 = &local_58;
    do {
      p_Var2 = (_List_node_base *)
               (pQVar17->spans).
               super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
               _M_impl._M_node._M_size;
      iVar14 = *(int *)&p_Var2->_M_prev;
      if (iVar14 < start) {
LAB_0058e35a:
        pQVar18 = (QSpanCollection *)
                  (pQVar17->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
      }
      else {
        iVar16 = *(int *)&p_Var2->_M_next;
        if (iVar16 < start) {
          if (end < iVar14) {
LAB_0058e2dd:
            *(int *)&p_Var2->_M_prev = iVar14 - iVar6;
          }
          else {
            *(int *)&p_Var2->_M_prev = start + -1;
          }
        }
        else {
          if (end < iVar14) {
            iVar15 = iVar16 - iVar6;
            if (iVar16 <= end) {
              iVar15 = start;
            }
            *(int *)&p_Var2->_M_next = iVar15;
            goto LAB_0058e2dd;
          }
          *(undefined1 *)&p_Var2[1]._M_next = 1;
        }
        if ((*(int *)&p_Var2->_M_next == *(int *)&p_Var2->_M_prev) &&
           (*(int *)((long)&p_Var2->_M_next + 4) == *(int *)((long)&p_Var2->_M_prev + 4))) {
          *(undefined1 *)&p_Var2[1]._M_next = 1;
        }
        if (*(char *)&p_Var2[1]._M_next != '\x01') goto LAB_0058e35a;
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = p_Var2;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        local_48 = local_48 + 1;
        pQVar18 = (QSpanCollection *)
                  (pQVar17->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        psVar1 = &(this->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pQVar17,0x18);
      }
      pQVar17 = pQVar18;
    } while (pQVar18 != this);
    pppppppuVar13 = local_58;
    if ((QSpanCollection *)
        (this->spans).
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next == this) {
      for (; (undefined8 ********)pppppppuVar13 != &local_58;
          pppppppuVar13 = (undefined8 *******)*pppppppuVar13) {
        if (pppppppuVar13[2] != (undefined8 ******)0x0) {
          operator_delete(pppppppuVar13[2],0x14);
        }
      }
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear(&this->index);
    }
    else {
      this_00 = &this->index;
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
      local_98._M_node = &(((this->index).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        p_Var11 = local_98._M_node;
        local_98._M_node = (_Base_ptr)std::_Rb_tree_decrement(local_98._M_node);
        iVar14 = -*(int *)((long)local_98._M_node + 0x20);
        this_01 = (SubIndex *)((long)local_98._M_node + 0x28);
        if (iVar14 < start) {
          bVar5 = cleanSpanSubIndex((QSpanCollection *)p_Var11,this_01,iVar14,false);
          if (bVar5) {
LAB_0058e69c:
            cVar12.i._M_node = (const_iterator)std::_Rb_tree_increment(local_98._M_node);
            local_98._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                           (this_00,(const_iterator)local_98._M_node,cVar12);
          }
        }
        else {
          if (end < iVar14) {
            iVar16 = *(int *)((long)local_98._M_node + 0x20) + iVar6;
            if (end + 1 == iVar14) {
              local_60.d.d.ptr._0_4_ = iVar16;
              iVar8._M_node =
                   (_Base_ptr)
                   QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::find(this_00,(int *)&local_60);
              QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
              if ((_Rb_tree_header *)iVar8._M_node ==
                  &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
                local_68.d.d.ptr._0_4_ = iVar16;
                local_60.d.d.ptr =
                     (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                      )(totally_ordered_wrapper<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_*>
                        )0x0;
                iVar8._M_node =
                     (_Base_ptr)
                     QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                               (this_00,(int *)&local_68,&local_60);
                QtPrivate::
                QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                ::~QExplicitlySharedDataPointerV2(&local_60.d);
              }
              QMap<int,_QSpanCollection::Span_*>::detach(this_01);
              p_Var9 = *(_Base_ptr *)
                        ((long)&(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                                _M_header + 0x10);
              QMap<int,_QSpanCollection::Span_*>::detach(this_01);
              if ((_Rb_tree_header *)p_Var9 !=
                  &(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
                do {
                  local_60.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                        )p_Var9[1]._M_parent;
                  if (*(char *)&(((_Rb_tree_header *)((long)local_60.d.d.ptr + 0x10))->_M_header).
                                _M_color == '\0') {
                    QMap<int,_QSpanCollection::Span_*>::insert
                              ((QMap<int,_QSpanCollection::Span_*> *)&iVar8._M_node[1]._M_parent,
                               (int *)(p_Var9 + 1),(Span **)&local_60);
                  }
                  p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
                  QMap<int,_QSpanCollection::Span_*>::detach(this_01);
                } while ((_Rb_tree_header *)p_Var9 !=
                         &(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header);
              }
            }
            else {
              local_60.d.d.ptr._0_4_ = iVar16;
              QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                        (this_00,(int *)&local_60,this_01);
            }
            goto LAB_0058e69c;
          }
          local_60.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                )(totally_ordered_wrapper<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_*>
                  )0x0;
          QMap<int,_QSpanCollection::Span_*>::detach(this_01);
          p_Var9 = *(_Base_ptr *)
                    ((long)&(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header +
                    0x10);
          QMap<int,_QSpanCollection::Span_*>::detach(this_01);
          pQVar3 = (this_01->d).d.ptr;
          bVar5 = false;
          while ((_Rb_tree_header *)p_Var9 != &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header) {
            local_68.d.d.ptr =
                 (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                  )p_Var9[1]._M_parent;
            if (*(char *)&(((_Rb_tree_header *)((long)local_68.d.d.ptr + 0x10))->_M_header)._M_color
                == '\0') {
              if ((!bVar5) && (*(int *)local_68.d.d.ptr == start)) {
                bVar5 = true;
              }
              QMap<int,_QSpanCollection::Span_*>::insert
                        (&local_60,(int *)(p_Var9 + 1),(Span **)&local_68);
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            QMap<int,_QSpanCollection::Span_*>::detach(this_01);
            pQVar3 = (this_01->d).d.ptr;
          }
          if ((iVar14 == start) && (bVar5)) {
            QMap<int,_QSpanCollection::Span_*>::clear(this_01);
          }
          else {
            cVar12.i._M_node = (const_iterator)std::_Rb_tree_increment(local_98._M_node);
            local_98._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                           (this_00,(const_iterator)local_98._M_node,cVar12);
          }
          if (bVar5) {
            cVar10._M_node = local_98._M_node;
            if (iVar14 != start) {
              local_68.d.d.ptr._0_4_ = -start;
              cVar10._M_node =
                   (_Base_ptr)
                   QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::find(this_00,(int *)&local_68);
              QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
              if ((_Rb_tree_header *)cVar10._M_node ==
                  &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
                local_68.d.d.ptr =
                     (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                      )(totally_ordered_wrapper<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_*>
                        )0x0;
                local_6c = -start;
                cVar10._M_node =
                     (_Base_ptr)
                     QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                               (this_00,&local_6c,&local_68);
                QtPrivate::
                QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                ::~QExplicitlySharedDataPointerV2(&local_68.d);
              }
            }
            QMap<int,_QSpanCollection::Span_*>::detach(&local_60);
            p_Var11 = *(_Rb_tree_node_base **)((long)local_60.d.d.ptr + 0x20);
            QMap<int,_QSpanCollection::Span_*>::detach(&local_60);
            if (p_Var11 != (_Rb_tree_node_base *)((long)local_60.d.d.ptr + 0x10)) {
              do {
                QMap<int,_QSpanCollection::Span_*>::insert
                          ((QMap<int,_QSpanCollection::Span_*> *)&cVar10._M_node[1]._M_parent,
                           (int *)(p_Var11 + 1),(Span **)&p_Var11[1]._M_parent);
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                QMap<int,_QSpanCollection::Span_*>::detach(&local_60);
              } while (p_Var11 != (_Rb_tree_node_base *)((long)local_60.d.d.ptr + 0x10));
            }
          }
          QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
          ::~QExplicitlySharedDataPointerV2(&local_60.d);
        }
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
        pppppppuVar13 = local_58;
      } while (local_98._M_node !=
               *(_Base_ptr *)
                ((long)&(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header +
                0x10));
      for (; (undefined8 ********)pppppppuVar13 != &local_58;
          pppppppuVar13 = (undefined8 *******)*pppppppuVar13) {
        if (pppppppuVar13[2] != (undefined8 ******)0x0) {
          operator_delete(pppppppuVar13[2],0x14);
        }
      }
    }
    pppppppuVar13 = local_58;
    while ((undefined8 ********)pppppppuVar13 != &local_58) {
      pppppppuVar4 = (undefined8 *******)*pppppppuVar13;
      operator_delete(pppppppuVar13,0x18);
      pppppppuVar13 = pppppppuVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanCollection::updateRemovedRows(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    SpanList spansToBeDeleted;
    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (SpanList::iterator it = spans.begin(); it != spans.end(); ) {
        Span *span = *it;
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_bottom < start) {
            ++it;
            continue;
        }
        if (span->m_top < start) {
            if (span->m_bottom <= end)
                span->m_bottom = start - 1;
            else
                span->m_bottom -= delta;
        } else {
            if (span->m_bottom > end) {
                if (span->m_top <= end)
                    span->m_top = start;
                else
                    span->m_top -= delta;
                span->m_bottom -= delta;
            } else {
                span->will_be_deleted = true;
            }
        }
        if (span->m_top == span->m_bottom && span->m_left == span->m_right)
            span->will_be_deleted = true;
        if (span->will_be_deleted) {
            spansToBeDeleted.push_back(span);
            it = spans.erase(it);
        } else {
            ++it;
        }
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif
    if (spans.empty()) {
        qDeleteAll(spansToBeDeleted);
        index.clear();
        return;
    }

    Index::iterator it_y = index.end();
    do {
        --it_y;
        int y = -it_y.key();
        SubIndex &subindex = it_y.value();
        if (y < start) {
            if (cleanSpanSubIndex(subindex, y))
                it_y = index.erase(it_y);
        } else if (y >= start && y <= end) {
            bool span_at_start = false;
            SubIndex spansToBeMoved;
            for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ++it) {
                Span *span = it.value();
                if (span->will_be_deleted)
                    continue;
                if (!span_at_start && span->m_top == start)
                    span_at_start = true;
                spansToBeMoved.insert(it.key(), span);
            }

            if (y == start && span_at_start)
                subindex.clear();
            else
                it_y = index.erase(it_y);

            if (span_at_start) {
                Index::iterator it_start;
                if (y == start)
                    it_start = it_y;
                else {
                    it_start = index.find(-start);
                    if (it_start == index.end())
                        it_start = index.insert(-start, SubIndex());
                }
                SubIndex &start_subindex = it_start.value();
                for (SubIndex::iterator it = spansToBeMoved.begin(); it != spansToBeMoved.end(); ++it)
                    start_subindex.insert(it.key(), it.value());
            }
        } else {
            if (y == end + 1) {
                Index::iterator it_top = index.find(-y + delta);
                if (it_top == index.end())
                    it_top = index.insert(-y + delta, SubIndex());
                for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ) {
                    Span *span = it.value();
                    if (!span->will_be_deleted)
                        it_top.value().insert(it.key(), span);
                    ++it;
                }
            } else {
                index.insert(-y + delta, subindex);
            }
            it_y = index.erase(it_y);
        }
    } while (it_y != index.begin());

#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
    qDebug("Deleted");
    qDebug() << spansToBeDeleted;
#endif
    qDeleteAll(spansToBeDeleted);
}